

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuickSort.h
# Opt level: O0

void JsUtil::
     QuickSort<Memory::_no_write_barrier_policy,_char,_int_(*)(void_*,_const_void_*,_const_void_*)>
     ::Sort(char *base,size_t nmemb,size_t size,_func_int_void_ptr_void_ptr_void_ptr *comparer,
           void *context)

{
  int iVar1;
  ulong uVar2;
  ulong local_48;
  size_t i;
  size_t pivot;
  size_t pos;
  void *context_local;
  _func_int_void_ptr_void_ptr_void_ptr *comparer_local;
  size_t size_local;
  size_t nmemb_local;
  char *base_local;
  
  if (base != (char *)0x0) {
    if (nmemb < 10) {
      switch(nmemb) {
      case 2:
        iVar1 = (*comparer)(context,base + size,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size,size);
        }
        break;
      case 3:
        iVar1 = (*comparer)(context,base + size,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size,size);
        }
        iVar1 = (*comparer)(context,base + size * 2,base + size);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size,base + size * 2,size);
        }
        iVar1 = (*comparer)(context,base + size,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size,size);
        }
        break;
      case 4:
        iVar1 = (*comparer)(context,base + size,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size,size);
        }
        iVar1 = (*comparer)(context,base + size * 3,base + size * 2);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 2,base + size * 3,size);
        }
        iVar1 = (*comparer)(context,base + size * 2,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size * 2,size);
        }
        iVar1 = (*comparer)(context,base + size * 3,base + size);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size,base + size * 3,size);
        }
        iVar1 = (*comparer)(context,base + size * 2,base + size);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size,base + size * 2,size);
        }
        break;
      case 5:
        iVar1 = (*comparer)(context,base + size,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size,size);
        }
        iVar1 = (*comparer)(context,base + size * 4,base + size * 3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 3,base + size * 4,size);
        }
        iVar1 = (*comparer)(context,base + size * 4,base + size * 2);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 2,base + size * 4,size);
        }
        iVar1 = (*comparer)(context,base + size * 3,base + size * 2);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 2,base + size * 3,size);
        }
        iVar1 = (*comparer)(context,base + size * 3,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size * 3,size);
        }
        iVar1 = (*comparer)(context,base + size * 2,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size * 2,size);
        }
        iVar1 = (*comparer)(context,base + size * 4,base + size);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size,base + size * 4,size);
        }
        iVar1 = (*comparer)(context,base + size * 3,base + size);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size,base + size * 3,size);
        }
        iVar1 = (*comparer)(context,base + size * 2,base + size);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size,base + size * 2,size);
        }
        break;
      case 6:
        iVar1 = (*comparer)(context,base + size * 2,base + size);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size,base + size * 2,size);
        }
        iVar1 = (*comparer)(context,base + size * 2,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size * 2,size);
        }
        iVar1 = (*comparer)(context,base + size,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size,size);
        }
        iVar1 = (*comparer)(context,base + size * 5,base + size * 4);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 4,base + size * 5,size);
        }
        iVar1 = (*comparer)(context,base + size * 5,base + size * 3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 3,base + size * 5,size);
        }
        iVar1 = (*comparer)(context,base + size * 4,base + size * 3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 3,base + size * 4,size);
        }
        iVar1 = (*comparer)(context,base + size * 3,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size * 3,size);
        }
        iVar1 = (*comparer)(context,base + size * 4,base + size);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size,base + size * 4,size);
        }
        iVar1 = (*comparer)(context,base + size * 5,base + size * 2);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 2,base + size * 5,size);
        }
        iVar1 = (*comparer)(context,base + size * 4,base + size * 2);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 2,base + size * 4,size);
        }
        iVar1 = (*comparer)(context,base + size * 3,base + size);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size,base + size * 3,size);
        }
        iVar1 = (*comparer)(context,base + size * 3,base + size * 2);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 2,base + size * 3,size);
        }
        break;
      case 7:
        iVar1 = (*comparer)(context,base + size * 2,base + size);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size,base + size * 2,size);
        }
        iVar1 = (*comparer)(context,base + size * 2,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size * 2,size);
        }
        iVar1 = (*comparer)(context,base + size,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size,size);
        }
        iVar1 = (*comparer)(context,base + size * 4,base + size * 3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 3,base + size * 4,size);
        }
        iVar1 = (*comparer)(context,base + size * 6,base + size * 5);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 5,base + size * 6,size);
        }
        iVar1 = (*comparer)(context,base + size * 5,base + size * 3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 3,base + size * 5,size);
        }
        iVar1 = (*comparer)(context,base + size * 6,base + size * 4);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 4,base + size * 6,size);
        }
        iVar1 = (*comparer)(context,base + size * 5,base + size * 4);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 4,base + size * 5,size);
        }
        iVar1 = (*comparer)(context,base + size * 4,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size * 4,size);
        }
        iVar1 = (*comparer)(context,base + size * 3,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size * 3,size);
        }
        iVar1 = (*comparer)(context,base + size * 5,base + size);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size,base + size * 5,size);
        }
        iVar1 = (*comparer)(context,base + size * 6,base + size * 2);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 2,base + size * 6,size);
        }
        iVar1 = (*comparer)(context,base + size * 5,base + size * 2);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 2,base + size * 5,size);
        }
        iVar1 = (*comparer)(context,base + size * 3,base + size);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size,base + size * 3,size);
        }
        iVar1 = (*comparer)(context,base + size * 4,base + size * 2);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 2,base + size * 4,size);
        }
        iVar1 = (*comparer)(context,base + size * 3,base + size * 2);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 2,base + size * 3,size);
        }
        break;
      case 8:
        iVar1 = (*comparer)(context,base + size,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size,size);
        }
        iVar1 = (*comparer)(context,base + size * 3,base + size * 2);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 2,base + size * 3,size);
        }
        iVar1 = (*comparer)(context,base + size * 2,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size * 2,size);
        }
        iVar1 = (*comparer)(context,base + size * 3,base + size);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size,base + size * 3,size);
        }
        iVar1 = (*comparer)(context,base + size * 2,base + size);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size,base + size * 2,size);
        }
        iVar1 = (*comparer)(context,base + size * 5,base + size * 4);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 4,base + size * 5,size);
        }
        iVar1 = (*comparer)(context,base + size * 7,base + size * 6);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 6,base + size * 7,size);
        }
        iVar1 = (*comparer)(context,base + size * 6,base + size * 4);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 4,base + size * 6,size);
        }
        iVar1 = (*comparer)(context,base + size * 7,base + size * 5);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 5,base + size * 7,size);
        }
        iVar1 = (*comparer)(context,base + size * 6,base + size * 5);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 5,base + size * 6,size);
        }
        iVar1 = (*comparer)(context,base + size * 4,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size * 4,size);
        }
        iVar1 = (*comparer)(context,base + size * 5,base + size);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size,base + size * 5,size);
        }
        iVar1 = (*comparer)(context,base + size * 4,base + size);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size,base + size * 4,size);
        }
        iVar1 = (*comparer)(context,base + size * 6,base + size * 2);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 2,base + size * 6,size);
        }
        iVar1 = (*comparer)(context,base + size * 7,base + size * 3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 3,base + size * 7,size);
        }
        iVar1 = (*comparer)(context,base + size * 6,base + size * 3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 3,base + size * 6,size);
        }
        iVar1 = (*comparer)(context,base + size * 4,base + size * 2);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 2,base + size * 4,size);
        }
        iVar1 = (*comparer)(context,base + size * 5,base + size * 3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 3,base + size * 5,size);
        }
        iVar1 = (*comparer)(context,base + size * 4,base + size * 3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 3,base + size * 4,size);
        }
        break;
      case 9:
        iVar1 = (*comparer)(context,base + size,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size,size);
        }
        iVar1 = (*comparer)(context,base + size * 4,base + size * 3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 3,base + size * 4,size);
        }
        iVar1 = (*comparer)(context,base + size * 7,base + size * 6);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 6,base + size * 7,size);
        }
        iVar1 = (*comparer)(context,base + size * 2,base + size);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size,base + size * 2,size);
        }
        iVar1 = (*comparer)(context,base + size * 5,base + size * 4);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 4,base + size * 5,size);
        }
        iVar1 = (*comparer)(context,base + size * 8,base + size * 7);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 7,base + size * 8,size);
        }
        iVar1 = (*comparer)(context,base + size,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size,size);
        }
        iVar1 = (*comparer)(context,base + size * 4,base + size * 3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 3,base + size * 4,size);
        }
        iVar1 = (*comparer)(context,base + size * 7,base + size * 6);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 6,base + size * 7,size);
        }
        iVar1 = (*comparer)(context,base + size * 3,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size * 3,size);
        }
        iVar1 = (*comparer)(context,base + size * 6,base + size * 3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 3,base + size * 6,size);
        }
        iVar1 = (*comparer)(context,base + size * 3,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,base + size * 3,size);
        }
        iVar1 = (*comparer)(context,base + size * 4,base + size);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size,base + size * 4,size);
        }
        iVar1 = (*comparer)(context,base + size * 7,base + size * 4);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 4,base + size * 7,size);
        }
        iVar1 = (*comparer)(context,base + size * 4,base + size);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size,base + size * 4,size);
        }
        iVar1 = (*comparer)(context,base + size * 5,base + size * 2);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 2,base + size * 5,size);
        }
        iVar1 = (*comparer)(context,base + size * 8,base + size * 5);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 5,base + size * 8,size);
        }
        iVar1 = (*comparer)(context,base + size * 5,base + size * 2);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 2,base + size * 5,size);
        }
        iVar1 = (*comparer)(context,base + size * 3,base + size);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size,base + size * 3,size);
        }
        iVar1 = (*comparer)(context,base + size * 7,base + size * 5);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 5,base + size * 7,size);
        }
        iVar1 = (*comparer)(context,base + size * 6,base + size * 2);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 2,base + size * 6,size);
        }
        iVar1 = (*comparer)(context,base + size * 6,base + size * 4);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 4,base + size * 6,size);
        }
        iVar1 = (*comparer)(context,base + size * 4,base + size * 2);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 2,base + size * 4,size);
        }
        iVar1 = (*comparer)(context,base + size * 3,base + size * 2);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 2,base + size * 3,size);
        }
        iVar1 = (*comparer)(context,base + size * 6,base + size * 5);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + size * 5,base + size * 6,size);
        }
      }
    }
    else {
      iVar1 = (*comparer)(context,base + (nmemb >> 2) * size,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                  (base,base + (nmemb >> 2) * size,size);
      }
      iVar1 = (*comparer)(context,base + (nmemb - 1) * size,base + (nmemb * 3 >> 2) * size);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                  (base + (nmemb * 3 >> 2) * size,base + (nmemb - 1) * size,size);
      }
      iVar1 = (*comparer)(context,base + (nmemb - 1) * size,base + (nmemb >> 1) * size);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                  (base + (nmemb >> 1) * size,base + (nmemb - 1) * size,size);
      }
      iVar1 = (*comparer)(context,base + (nmemb * 3 >> 2) * size,base + (nmemb >> 1) * size);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                  (base + (nmemb >> 1) * size,base + (nmemb * 3 >> 2) * size,size);
      }
      iVar1 = (*comparer)(context,base + (nmemb * 3 >> 2) * size,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                  (base,base + (nmemb * 3 >> 2) * size,size);
      }
      iVar1 = (*comparer)(context,base + (nmemb >> 1) * size,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                  (base,base + (nmemb >> 1) * size,size);
      }
      iVar1 = (*comparer)(context,base + (nmemb - 1) * size,base + (nmemb >> 2) * size);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                  (base + (nmemb >> 2) * size,base + (nmemb - 1) * size,size);
      }
      iVar1 = (*comparer)(context,base + (nmemb * 3 >> 2) * size,base + (nmemb >> 2) * size);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                  (base + (nmemb >> 2) * size,base + (nmemb * 3 >> 2) * size,size);
      }
      iVar1 = (*comparer)(context,base + (nmemb >> 1) * size,base + (nmemb >> 2) * size);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                  (base + (nmemb >> 2) * size,base + (nmemb >> 1) * size,size);
      }
      pivot = 0;
      uVar2 = (nmemb - 1) * size;
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                (base + uVar2,base + (nmemb >> 1) * size,size);
      for (local_48 = 0; local_48 < (nmemb >> 1) * size; local_48 = size + local_48) {
        iVar1 = (*comparer)(context,base + local_48,base + uVar2);
        if (iVar1 < 1) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + local_48,base + pivot * size,size);
          pivot = pivot + 1;
        }
      }
      for (; local_48 < uVar2; local_48 = size + local_48) {
        iVar1 = (*comparer)(context,base + local_48,base + uVar2);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                    (base + local_48,base + pivot * size,size);
          pivot = pivot + 1;
        }
      }
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                (base + pivot * size,base + uVar2,size);
      Sort(base,pivot,size,comparer,context);
      Sort(base + (pivot + 1) * size,nmemb - (pivot + 1),size,comparer,context);
    }
  }
  return;
}

Assistant:

static void Sort(T* base, size_t nmemb, size_t size, Comparer comparer, void* context)
        {
            if (!base)
            {
                return;
            }

            if (nmemb <= 9) // use sorting networks for members <= 2^3
            {
                switch(nmemb)
                {
                    case 9:
                        CCQ_SORT9()
                        break;
                    case 8:
                        CCQ_SORT8()
                        break;
                    case 7:
                        CCQ_SORT7()
                        break;
                    case 6:
                        CCQ_SORT6()
                        break;
                    case 5:
                        CCQ_SORT5(0, 1, 2, 3, 4)
                        break;
                    case 4:
                        CCQ_SORT4()
                        break;
                    case 3:
                        CCQ_SORT3()
                        break;
                    case 2:
                        CCQ_SORT2(0, 1)
                        break;
                    default:
                        break; // nothing to sort
                }

                return;
            }

            CCQ_SORT5(0, (nmemb / 4), (nmemb / 2), ((3 * nmemb) / 4), (nmemb - 1));
            // guess the median is in the middle now.
            size_t pos = 0;
            const size_t pivot = (nmemb - 1) * size;
            // make last element the median(pivot)
            CCQ_SWAP(base + pivot, base + ((nmemb / 2) * size), size);

            // standard qsort pt. below
            size_t i = 0;
            for (; i < nmemb / 2 * size; i+= size)
            {
                // During the first half, count equal values as below the pivot
                if (comparer(context, base + i, base + pivot) <= 0)
                {
                    CCQ_SWAP(base + i, base + (pos * size), size);
                    pos++;
                }
            }

            for (; i < pivot; i+= size)
            {
                // During the second half, count equal values as above the pivot
                if (comparer(context, base + i, base + pivot) < 0)
                {
                    CCQ_SWAP(base + i, base + (pos * size), size);
                    pos++;
                }
            }

            // issue the last change
            CCQ_SWAP(base + (pos * size), base + pivot, size);

            Sort(base, pos++, size, comparer, context);
            Sort(base + (pos * size), nmemb - pos, size, comparer, context);
        }